

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O3

void __thiscall Rml::ElementStyle::UpdateDefinition(ElementStyle *this)

{
  StyleSheetNode *this_00;
  ElementDefinition *this_01;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PropertyIdSet *pPVar4;
  PropertyIdSet *pPVar5;
  Property *this_02;
  Property *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  PropertyId id;
  size_t __position;
  ElementDefinition *__tmp;
  undefined1 this_04 [8];
  undefined1 auVar6 [16];
  SharedPtr<const_ElementDefinition> new_definition;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  _Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  bitset<128UL> local_48;
  
  local_58.super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl =
       (_Head_base<0UL,_Rml::StyleSheetNode_*,_false>)(StyleSheetNode *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar3 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
  if ((Element *)CONCAT44(extraout_var,iVar3) == (Element *)0x0) {
    this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_04 = (undefined1  [8])0x0;
  }
  else {
    StyleSheet::GetElementDefinition((StyleSheet *)local_68,(Element *)CONCAT44(extraout_var,iVar3))
    ;
    local_58.super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl =
         (_Head_base<0UL,_Rml::StyleSheetNode_*,_false>)
         (_Head_base<0UL,_Rml::StyleSheetNode_*,_false>)local_68;
    _Stack_50._M_pi = p_Stack_60;
    this_03._M_pi = p_Stack_60;
    this_04 = local_68;
  }
  this_00 = (StyleSheetNode *)
            (this->definition).
            super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_04 == (undefined1  [8])this_00) goto LAB_0022d477;
  local_68 = (undefined1  [8])0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (StyleSheetNode *)0x0) {
    pPVar4 = ElementDefinition::GetPropertyIds((ElementDefinition *)this_00);
    local_68 = (undefined1  [8])(pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[0];
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[1];
  }
  if (this_04 != (undefined1  [8])0x0) {
    pPVar4 = ElementDefinition::GetPropertyIds((ElementDefinition *)this_04);
    local_68 = (undefined1  [8])
               ((pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[0] | (ulong)local_68);
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[1] | (ulong)p_Stack_60);
    this_01 = (this->definition).
              super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_01 != (ElementDefinition *)0x0) {
      pPVar4 = ElementDefinition::GetPropertyIds(this_01);
      pPVar5 = ElementDefinition::GetPropertyIds((ElementDefinition *)this_04);
      local_48.super__Base_bitset<2UL>._M_w[0]._0_4_ =
           (uint)(pPVar5->defined_ids).super__Base_bitset<2UL>._M_w[0] &
           (uint)(pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[0];
      local_48.super__Base_bitset<2UL>._M_w[0]._4_4_ =
           *(uint *)((long)(pPVar5->defined_ids).super__Base_bitset<2UL>._M_w + 4) &
           *(uint *)((long)(pPVar4->defined_ids).super__Base_bitset<2UL>._M_w + 4);
      local_48.super__Base_bitset<2UL>._M_w[1]._0_4_ =
           (uint)(pPVar5->defined_ids).super__Base_bitset<2UL>._M_w[1] &
           (uint)(pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[1];
      local_48.super__Base_bitset<2UL>._M_w[1]._4_4_ =
           *(uint *)((long)(pPVar5->defined_ids).super__Base_bitset<2UL>._M_w + 0xc) &
           *(uint *)((long)(pPVar4->defined_ids).super__Base_bitset<2UL>._M_w + 0xc);
      auVar6._0_4_ = -(uint)((uint)local_48.super__Base_bitset<2UL>._M_w[0] == 0);
      auVar6._4_4_ = -(uint)(local_48.super__Base_bitset<2UL>._M_w[0]._4_4_ == 0);
      auVar6._8_4_ = -(uint)((uint)local_48.super__Base_bitset<2UL>._M_w[1] == 0);
      auVar6._12_4_ = -(uint)(local_48.super__Base_bitset<2UL>._M_w[1]._4_4_ == 0);
      iVar3 = movmskps((int)pPVar5,auVar6);
      if (iVar3 != 0xf) {
        __position = 1;
        do {
          bVar2 = ::std::bitset<128UL>::test(&local_48,__position);
          if (bVar2) goto LAB_0022d42e;
          __position = __position + 1;
        } while (__position != 0x80);
      }
      goto LAB_0022d43b;
    }
  }
  goto LAB_0022d451;
LAB_0022d42e:
  while (__position != 0x80) {
    id = (PropertyId)__position;
    this_02 = ElementDefinition::GetProperty
                        ((this->definition).
                         super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,id);
    other = ElementDefinition::GetProperty((ElementDefinition *)this_04,id);
    if (((other != (Property *)0x0 && this_02 != (Property *)0x0) && (this_02->unit == other->unit))
       && (bVar2 = Variant::operator==(&this_02->value,&other->value), bVar2)) {
      PropertyIdSet::Erase((PropertyIdSet *)local_68,id);
    }
    __position = __position + 1;
    if (__position < 0x80) {
      while (bVar2 = ::std::bitset<128UL>::test(&local_48,__position), !bVar2) {
        __position = __position + 1;
        if (__position == 0x80) goto LAB_0022d43b;
      }
    }
  }
LAB_0022d43b:
  TransitionPropertyChanges
            (this->element,(PropertyIdSet *)local_68,&this->inline_properties,
             (this->definition).
             super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (ElementDefinition *)this_04);
LAB_0022d451:
  (this->definition).super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_04;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->definition).
              super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_50);
  uVar1 = (this->dirty_properties).defined_ids.super__Base_bitset<2UL>._M_w[1];
  (this->dirty_properties).defined_ids.super__Base_bitset<2UL>._M_w[0] =
       (this->dirty_properties).defined_ids.super__Base_bitset<2UL>._M_w[0] | (ulong)local_68;
  (this->dirty_properties).defined_ids.super__Base_bitset<2UL>._M_w[1] = uVar1 | (ulong)p_Stack_60;
  this_03._M_pi = _Stack_50._M_pi;
LAB_0022d477:
  if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
  }
  return;
}

Assistant:

void ElementStyle::UpdateDefinition()
{
	RMLUI_ZoneScoped;

	SharedPtr<const ElementDefinition> new_definition;

	if (const StyleSheet* style_sheet = element->GetStyleSheet())
	{
		new_definition = style_sheet->GetElementDefinition(element);
	}

	// Switch the property definitions if the definition has changed.
	if (new_definition != definition)
	{
		PropertyIdSet changed_properties;

		if (definition)
			changed_properties = definition->GetPropertyIds();

		if (new_definition)
			changed_properties |= new_definition->GetPropertyIds();

		if (definition && new_definition)
		{
			// Remove properties that compare equal from the changed list.
			const PropertyIdSet properties_in_both_definitions = (definition->GetPropertyIds() & new_definition->GetPropertyIds());

			for (PropertyId id : properties_in_both_definitions)
			{
				const Property* p0 = definition->GetProperty(id);
				const Property* p1 = new_definition->GetProperty(id);
				if (p0 && p1 && *p0 == *p1)
					changed_properties.Erase(id);
			}

			// Transition changed properties if transition property is set
			TransitionPropertyChanges(element, changed_properties, inline_properties, definition.get(), new_definition.get());
		}

		definition = new_definition;

		DirtyProperties(changed_properties);
	}
}